

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

void xml_data(void *userData,char *s,size_t len)

{
  uint uVar1;
  xar *xar_00;
  int iVar2;
  uint64_t uVar3;
  int64_t iVar4;
  time_t tVar5;
  size_t sVar6;
  xar *xar;
  archive_read *a;
  size_t len_local;
  char *s_local;
  void *userData_local;
  
  xar_00 = (xar *)**(undefined8 **)((long)userData + 0x818);
  if (xar_00->xmlsts == TOC_CHECKSUM_OFFSET) {
    uVar3 = atol10(s,len);
    xar_00->toc_chksum_offset = uVar3;
  }
  else if (xar_00->xmlsts == TOC_CHECKSUM_SIZE) {
    uVar3 = atol10(s,len);
    xar_00->toc_chksum_size = uVar3;
  }
  if (xar_00->file != (xar_file *)0x0) {
    switch(xar_00->xmlsts) {
    case INIT:
    case XAR:
    case TOC:
    case TOC_CREATION_TIME:
    case TOC_CHECKSUM:
    case TOC_CHECKSUM_OFFSET:
    case TOC_CHECKSUM_SIZE:
    case TOC_FILE:
    case FILE_DATA:
    case FILE_DATA_ENCODING:
    case FILE_DATA_CONTENT:
    case FILE_EA:
    case FILE_EA_ENCODING:
    case FILE_DEVICE:
    case FILE_ACL:
    case FILE_FLAGS:
    case FILE_FLAGS_USER_NODUMP:
    case FILE_FLAGS_USER_IMMUTABLE:
    case FILE_FLAGS_USER_APPEND:
    case FILE_FLAGS_USER_OPAQUE:
    case FILE_FLAGS_USER_NOUNLINK:
    case FILE_FLAGS_SYS_ARCHIVED:
    case FILE_FLAGS_SYS_IMMUTABLE:
    case FILE_FLAGS_SYS_APPEND:
    case FILE_FLAGS_SYS_NOUNLINK:
    case FILE_FLAGS_SYS_SNAPSHOT:
    case FILE_EXT2:
    case FILE_EXT2_SecureDeletion:
    case FILE_EXT2_Undelete:
    case FILE_EXT2_Compress:
    case FILE_EXT2_Synchronous:
    case FILE_EXT2_Immutable:
    case FILE_EXT2_AppendOnly:
    case FILE_EXT2_NoDump:
    case FILE_EXT2_NoAtime:
    case FILE_EXT2_CompDirty:
    case FILE_EXT2_CompBlock:
    case FILE_EXT2_NoCompBlock:
    case FILE_EXT2_CompError:
    case FILE_EXT2_BTree:
    case FILE_EXT2_HashIndexed:
    case FILE_EXT2_iMagic:
    case FILE_EXT2_Journaled:
    case FILE_EXT2_NoTail:
    case FILE_EXT2_DirSync:
    case FILE_EXT2_TopDir:
    case FILE_EXT2_Reserved:
    case UNKNOWN:
      break;
    case FILE_DATA_LENGTH:
      xar_00->file->has = xar_00->file->has | 1;
      uVar3 = atol10(s,len);
      xar_00->file->length = uVar3;
      break;
    case FILE_DATA_OFFSET:
      xar_00->file->has = xar_00->file->has | 1;
      uVar3 = atol10(s,len);
      xar_00->file->offset = uVar3;
      break;
    case FILE_DATA_SIZE:
      xar_00->file->has = xar_00->file->has | 1;
      uVar3 = atol10(s,len);
      xar_00->file->size = uVar3;
      break;
    case FILE_DATA_A_CHECKSUM:
      sVar6 = atohex((xar_00->file->a_sum).val,0x14,s,len);
      (xar_00->file->a_sum).len = sVar6;
      break;
    case FILE_DATA_E_CHECKSUM:
      sVar6 = atohex((xar_00->file->e_sum).val,0x14,s,len);
      (xar_00->file->e_sum).len = sVar6;
      break;
    case FILE_EA_LENGTH:
      xar_00->file->has = xar_00->file->has | 0x2000;
      uVar3 = atol10(s,len);
      xar_00->xattr->length = uVar3;
      break;
    case FILE_EA_OFFSET:
      xar_00->file->has = xar_00->file->has | 0x2000;
      uVar3 = atol10(s,len);
      xar_00->xattr->offset = uVar3;
      break;
    case FILE_EA_SIZE:
      xar_00->file->has = xar_00->file->has | 0x2000;
      uVar3 = atol10(s,len);
      xar_00->xattr->size = uVar3;
      break;
    case FILE_EA_A_CHECKSUM:
      xar_00->file->has = xar_00->file->has | 0x2000;
      sVar6 = atohex((xar_00->xattr->a_sum).val,0x14,s,len);
      (xar_00->xattr->a_sum).len = sVar6;
      break;
    case FILE_EA_E_CHECKSUM:
      xar_00->file->has = xar_00->file->has | 0x2000;
      sVar6 = atohex((xar_00->xattr->e_sum).val,0x14,s,len);
      (xar_00->xattr->e_sum).len = sVar6;
      break;
    case FILE_EA_NAME:
      xar_00->file->has = xar_00->file->has | 0x2000;
      (xar_00->xattr->name).length = 0;
      archive_strncat(&xar_00->xattr->name,s,len);
      break;
    case FILE_EA_FSTYPE:
      xar_00->file->has = xar_00->file->has | 0x2000;
      (xar_00->xattr->fstype).length = 0;
      archive_strncat(&xar_00->xattr->fstype,s,len);
      break;
    case FILE_CTIME:
      xar_00->file->has = xar_00->file->has | 0x8008;
      tVar5 = parse_time(s,len);
      xar_00->file->ctime = tVar5;
      break;
    case FILE_MTIME:
      xar_00->file->has = xar_00->file->has | 0x10008;
      tVar5 = parse_time(s,len);
      xar_00->file->mtime = tVar5;
      break;
    case FILE_ATIME:
      xar_00->file->has = xar_00->file->has | 0x20008;
      tVar5 = parse_time(s,len);
      xar_00->file->atime = tVar5;
      break;
    case FILE_GROUP:
      xar_00->file->has = xar_00->file->has | 0x20;
      (xar_00->file->gname).length = 0;
      archive_strncat(&xar_00->file->gname,s,len);
      break;
    case FILE_GID:
      xar_00->file->has = xar_00->file->has | 0x20;
      uVar3 = atol10(s,len);
      xar_00->file->gid = uVar3;
      break;
    case FILE_USER:
      xar_00->file->has = xar_00->file->has | 0x10;
      (xar_00->file->uname).length = 0;
      archive_strncat(&xar_00->file->uname,s,len);
      break;
    case FILE_UID:
      xar_00->file->has = xar_00->file->has | 0x10;
      uVar3 = atol10(s,len);
      xar_00->file->uid = uVar3;
      break;
    case FILE_MODE:
      xar_00->file->has = xar_00->file->has | 0x40;
      uVar1 = xar_00->file->mode;
      iVar4 = atol8(s,len);
      xar_00->file->mode = uVar1 & 0xf000 | (uint)iVar4 & 0xffff0fff;
      break;
    case FILE_DEVICE_MAJOR:
      xar_00->file->has = xar_00->file->has | 0x200;
      uVar3 = atol10(s,len);
      xar_00->file->devmajor = uVar3;
      break;
    case FILE_DEVICE_MINOR:
      xar_00->file->has = xar_00->file->has | 0x400;
      uVar3 = atol10(s,len);
      xar_00->file->devminor = uVar3;
      break;
    case FILE_DEVICENO:
      xar_00->file->has = xar_00->file->has | 0x100;
      uVar3 = atol10(s,len);
      xar_00->file->dev = uVar3;
      break;
    case FILE_INODE:
      xar_00->file->has = xar_00->file->has | 0x800;
      uVar3 = atol10(s,len);
      xar_00->file->ino64 = uVar3;
      break;
    case FILE_LINK:
      xar_00->file->has = xar_00->file->has | 4;
      (xar_00->file->symlink).length = 0;
      archive_strncat(&xar_00->file->symlink,s,len);
      break;
    case FILE_TYPE:
      iVar2 = is_string("file",s,len);
      if ((iVar2 == 0) || (iVar2 = is_string("hardlink",s,len), iVar2 == 0)) {
        xar_00->file->mode = xar_00->file->mode & 0xffff0fff | 0x8000;
      }
      iVar2 = is_string("directory",s,len);
      if (iVar2 == 0) {
        xar_00->file->mode = xar_00->file->mode & 0xffff0fff | 0x4000;
      }
      iVar2 = is_string("symlink",s,len);
      if (iVar2 == 0) {
        xar_00->file->mode = xar_00->file->mode & 0xffff0fff | 0xa000;
      }
      iVar2 = is_string("character special",s,len);
      if (iVar2 == 0) {
        xar_00->file->mode = xar_00->file->mode & 0xffff0fff | 0x2000;
      }
      iVar2 = is_string("block special",s,len);
      if (iVar2 == 0) {
        xar_00->file->mode = xar_00->file->mode & 0xffff0fff | 0x6000;
      }
      iVar2 = is_string("socket",s,len);
      if (iVar2 == 0) {
        xar_00->file->mode = xar_00->file->mode & 0xffff0fff | 0xc000;
      }
      iVar2 = is_string("fifo",s,len);
      if (iVar2 == 0) {
        xar_00->file->mode = xar_00->file->mode & 0xffff0fff | 0x1000;
      }
      xar_00->file->has = xar_00->file->has | 0x80;
      break;
    case FILE_NAME:
      if ((xar_00->file->has & 2) == 0) {
        if (xar_00->file->parent != (xar_file *)0x0) {
          archive_string_concat(&xar_00->file->pathname,&xar_00->file->parent->pathname);
          archive_strappend_char(&xar_00->file->pathname,'/');
        }
        xar_00->file->has = xar_00->file->has | 2;
        if (xar_00->base64text == 0) {
          archive_strncat(&xar_00->file->pathname,s,len);
        }
        else {
          strappend_base64(xar_00,&xar_00->file->pathname,s,len);
        }
      }
      break;
    case FILE_ACL_DEFAULT:
    case FILE_ACL_ACCESS:
    case FILE_ACL_APPLEEXTENDED:
      xar_00->file->has = xar_00->file->has | 0x4000;
    }
  }
  return;
}

Assistant:

static void
xml_data(void *userData, const char *s, size_t len)
{
	struct archive_read *a;
	struct xar *xar;

	a = (struct archive_read *)userData;
	xar = (struct xar *)(a->format->data);

#if DEBUG
	{
		char buff[1024];
		if (len > (int)(sizeof(buff)-1))
			len = (int)(sizeof(buff)-1);
		strncpy(buff, s, len);
		buff[len] = 0;
		fprintf(stderr, "\tlen=%d:\"%s\"\n", len, buff);
	}
#endif
	switch (xar->xmlsts) {
	case TOC_CHECKSUM_OFFSET:
		xar->toc_chksum_offset = atol10(s, len);
		break;
	case TOC_CHECKSUM_SIZE:
		xar->toc_chksum_size = atol10(s, len);
		break;
	default:
		break;
	}
	if (xar->file == NULL)
		return;

	switch (xar->xmlsts) {
	case FILE_NAME:
		if (xar->file->has & HAS_PATHNAME)
			break;

		if (xar->file->parent != NULL) {
			archive_string_concat(&(xar->file->pathname),
			    &(xar->file->parent->pathname));
			archive_strappend_char(&(xar->file->pathname), '/');
		}
		xar->file->has |= HAS_PATHNAME;
		if (xar->base64text) {
			strappend_base64(xar,
			    &(xar->file->pathname), s, len);
		} else
			archive_strncat(&(xar->file->pathname), s, len);
		break;
	case FILE_LINK:
		xar->file->has |= HAS_SYMLINK;
		archive_strncpy(&(xar->file->symlink), s, len);
		break;
	case FILE_TYPE:
		if (is_string("file", s, len) == 0 ||
		    is_string("hardlink", s, len) == 0)
			xar->file->mode =
			    (xar->file->mode & ~AE_IFMT) | AE_IFREG;
		if (is_string("directory", s, len) == 0)
			xar->file->mode =
			    (xar->file->mode & ~AE_IFMT) | AE_IFDIR;
		if (is_string("symlink", s, len) == 0)
			xar->file->mode =
			    (xar->file->mode & ~AE_IFMT) | AE_IFLNK;
		if (is_string("character special", s, len) == 0)
			xar->file->mode =
			    (xar->file->mode & ~AE_IFMT) | AE_IFCHR;
		if (is_string("block special", s, len) == 0)
			xar->file->mode =
			    (xar->file->mode & ~AE_IFMT) | AE_IFBLK;
		if (is_string("socket", s, len) == 0)
			xar->file->mode =
			    (xar->file->mode & ~AE_IFMT) | AE_IFSOCK;
		if (is_string("fifo", s, len) == 0)
			xar->file->mode =
			    (xar->file->mode & ~AE_IFMT) | AE_IFIFO;
		xar->file->has |= HAS_TYPE;
		break;
	case FILE_INODE:
		xar->file->has |= HAS_INO;
		xar->file->ino64 = atol10(s, len);
		break;
	case FILE_DEVICE_MAJOR:
		xar->file->has |= HAS_DEVMAJOR;
		xar->file->devmajor = (dev_t)atol10(s, len);
		break;
	case FILE_DEVICE_MINOR:
		xar->file->has |= HAS_DEVMINOR;
		xar->file->devminor = (dev_t)atol10(s, len);
		break;
	case FILE_DEVICENO:
		xar->file->has |= HAS_DEV;
		xar->file->dev = (dev_t)atol10(s, len);
		break;
	case FILE_MODE:
		xar->file->has |= HAS_MODE;
		xar->file->mode =
		    (xar->file->mode & AE_IFMT) |
		    ((mode_t)(atol8(s, len)) & ~AE_IFMT);
		break;
	case FILE_GROUP:
		xar->file->has |= HAS_GID;
		archive_strncpy(&(xar->file->gname), s, len);
		break;
	case FILE_GID:
		xar->file->has |= HAS_GID;
		xar->file->gid = atol10(s, len);
		break;
	case FILE_USER:
		xar->file->has |= HAS_UID;
		archive_strncpy(&(xar->file->uname), s, len);
		break;
	case FILE_UID:
		xar->file->has |= HAS_UID;
		xar->file->uid = atol10(s, len);
		break;
	case FILE_CTIME:
		xar->file->has |= HAS_TIME | HAS_CTIME;
		xar->file->ctime = parse_time(s, len);
		break;
	case FILE_MTIME:
		xar->file->has |= HAS_TIME | HAS_MTIME;
		xar->file->mtime = parse_time(s, len);
		break;
	case FILE_ATIME:
		xar->file->has |= HAS_TIME | HAS_ATIME;
		xar->file->atime = parse_time(s, len);
		break;
	case FILE_DATA_LENGTH:
		xar->file->has |= HAS_DATA;
		xar->file->length = atol10(s, len);
		break;
	case FILE_DATA_OFFSET:
		xar->file->has |= HAS_DATA;
		xar->file->offset = atol10(s, len);
		break;
	case FILE_DATA_SIZE:
		xar->file->has |= HAS_DATA;
		xar->file->size = atol10(s, len);
		break;
	case FILE_DATA_A_CHECKSUM:
		xar->file->a_sum.len = atohex(xar->file->a_sum.val,
		    sizeof(xar->file->a_sum.val), s, len);
		break;
	case FILE_DATA_E_CHECKSUM:
		xar->file->e_sum.len = atohex(xar->file->e_sum.val,
		    sizeof(xar->file->e_sum.val), s, len);
		break;
	case FILE_EA_LENGTH:
		xar->file->has |= HAS_XATTR;
		xar->xattr->length = atol10(s, len);
		break;
	case FILE_EA_OFFSET:
		xar->file->has |= HAS_XATTR;
		xar->xattr->offset = atol10(s, len);
		break;
	case FILE_EA_SIZE:
		xar->file->has |= HAS_XATTR;
		xar->xattr->size = atol10(s, len);
		break;
	case FILE_EA_A_CHECKSUM:
		xar->file->has |= HAS_XATTR;
		xar->xattr->a_sum.len = atohex(xar->xattr->a_sum.val,
		    sizeof(xar->xattr->a_sum.val), s, len);
		break;
	case FILE_EA_E_CHECKSUM:
		xar->file->has |= HAS_XATTR;
		xar->xattr->e_sum.len = atohex(xar->xattr->e_sum.val,
		    sizeof(xar->xattr->e_sum.val), s, len);
		break;
	case FILE_EA_NAME:
		xar->file->has |= HAS_XATTR;
		archive_strncpy(&(xar->xattr->name), s, len);
		break;
	case FILE_EA_FSTYPE:
		xar->file->has |= HAS_XATTR;
		archive_strncpy(&(xar->xattr->fstype), s, len);
		break;
	case FILE_ACL_DEFAULT:
	case FILE_ACL_ACCESS:
	case FILE_ACL_APPLEEXTENDED:
		xar->file->has |= HAS_ACL;
		/* TODO */
		break;
	case INIT:
	case XAR:
	case TOC:
	case TOC_CREATION_TIME:
	case TOC_CHECKSUM:
	case TOC_CHECKSUM_OFFSET:
	case TOC_CHECKSUM_SIZE:
	case TOC_FILE:
	case FILE_DATA:
	case FILE_DATA_ENCODING:
	case FILE_DATA_CONTENT:
	case FILE_DEVICE:
	case FILE_EA:
	case FILE_EA_ENCODING:
	case FILE_ACL:
	case FILE_FLAGS:
	case FILE_FLAGS_USER_NODUMP:
	case FILE_FLAGS_USER_IMMUTABLE:
	case FILE_FLAGS_USER_APPEND:
	case FILE_FLAGS_USER_OPAQUE:
	case FILE_FLAGS_USER_NOUNLINK:
	case FILE_FLAGS_SYS_ARCHIVED:
	case FILE_FLAGS_SYS_IMMUTABLE:
	case FILE_FLAGS_SYS_APPEND:
	case FILE_FLAGS_SYS_NOUNLINK:
	case FILE_FLAGS_SYS_SNAPSHOT:
	case FILE_EXT2:
	case FILE_EXT2_SecureDeletion:
	case FILE_EXT2_Undelete:
	case FILE_EXT2_Compress:
	case FILE_EXT2_Synchronous:
	case FILE_EXT2_Immutable:
	case FILE_EXT2_AppendOnly:
	case FILE_EXT2_NoDump:
	case FILE_EXT2_NoAtime:
	case FILE_EXT2_CompDirty:
	case FILE_EXT2_CompBlock:
	case FILE_EXT2_NoCompBlock:
	case FILE_EXT2_CompError:
	case FILE_EXT2_BTree:
	case FILE_EXT2_HashIndexed:
	case FILE_EXT2_iMagic:
	case FILE_EXT2_Journaled:
	case FILE_EXT2_NoTail:
	case FILE_EXT2_DirSync:
	case FILE_EXT2_TopDir:
	case FILE_EXT2_Reserved:
	case UNKNOWN:
		break;
	}
}